

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O3

IPStatsRecord * __thiscall IPStatsRecord::CreateCopy(IPStatsRecord *this)

{
  size_t __n;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  uint64_t uVar32;
  uint64_t uVar33;
  uint64_t uVar34;
  uint64_t uVar35;
  uint64_t uVar36;
  uint64_t uVar37;
  uint64_t uVar38;
  IPStatsRecord *pIVar39;
  
  pIVar39 = (IPStatsRecord *)operator_new(0x368);
  memset(pIVar39->ip_addr,0,0x360);
  __n = this->ipaddr_length;
  pIVar39->ipaddr_length = __n;
  pIVar39->query_volume = this->query_volume;
  uVar32 = this->no_such_domain_queries;
  pIVar39->arpa_count = this->arpa_count;
  pIVar39->no_such_domain_queries = uVar32;
  uVar32 = this->no_such_domain_frequent;
  pIVar39->no_such_domain_reserved = this->no_such_domain_reserved;
  pIVar39->no_such_domain_frequent = uVar32;
  pIVar39->no_such_domain_chromioids = this->no_such_domain_chromioids;
  memcpy(pIVar39->ip_addr,this->ip_addr,__n);
  memcpy(pIVar39->hourly_volume,this->hourly_volume,0xc0);
  memcpy(pIVar39->daily_volume,this->daily_volume,0xf8);
  uVar32 = this->tld_counts[0];
  uVar33 = this->tld_counts[1];
  uVar34 = this->tld_counts[2];
  uVar35 = this->tld_counts[3];
  uVar36 = this->tld_counts[4];
  uVar37 = this->tld_counts[5];
  uVar38 = this->tld_counts[7];
  pIVar39->tld_counts[6] = this->tld_counts[6];
  pIVar39->tld_counts[7] = uVar38;
  pIVar39->tld_counts[4] = uVar36;
  pIVar39->tld_counts[5] = uVar37;
  pIVar39->tld_counts[2] = uVar34;
  pIVar39->tld_counts[3] = uVar35;
  pIVar39->tld_counts[0] = uVar32;
  pIVar39->tld_counts[1] = uVar33;
  bVar8 = (this->tld_hyperlog).hllv[0];
  bVar9 = (this->tld_hyperlog).hllv[1];
  bVar10 = (this->tld_hyperlog).hllv[2];
  bVar11 = (this->tld_hyperlog).hllv[3];
  bVar12 = (this->tld_hyperlog).hllv[4];
  bVar13 = (this->tld_hyperlog).hllv[5];
  bVar14 = (this->tld_hyperlog).hllv[6];
  bVar15 = (this->tld_hyperlog).hllv[7];
  uVar16 = (this->tld_hyperlog).hllv[8];
  uVar17 = (this->tld_hyperlog).hllv[9];
  uVar18 = (this->tld_hyperlog).hllv[10];
  uVar19 = (this->tld_hyperlog).hllv[0xb];
  uVar20 = (this->tld_hyperlog).hllv[0xc];
  uVar21 = (this->tld_hyperlog).hllv[0xd];
  uVar22 = (this->tld_hyperlog).hllv[0xe];
  uVar23 = (this->tld_hyperlog).hllv[0xf];
  bVar24 = (pIVar39->tld_hyperlog).hllv[0];
  bVar25 = (pIVar39->tld_hyperlog).hllv[1];
  bVar26 = (pIVar39->tld_hyperlog).hllv[2];
  bVar27 = (pIVar39->tld_hyperlog).hllv[3];
  bVar28 = (pIVar39->tld_hyperlog).hllv[4];
  bVar29 = (pIVar39->tld_hyperlog).hllv[5];
  bVar30 = (pIVar39->tld_hyperlog).hllv[6];
  bVar31 = (pIVar39->tld_hyperlog).hllv[7];
  bVar1 = (byte)((bVar8 < bVar24) * bVar8 | (bVar8 >= bVar24) * bVar24) == bVar8;
  bVar2 = (byte)((bVar9 < bVar25) * bVar9 | (bVar9 >= bVar25) * bVar25) != bVar9;
  bVar3 = (byte)((bVar10 < bVar26) * bVar10 | (bVar10 >= bVar26) * bVar26) == bVar10;
  bVar4 = (byte)((bVar11 < bVar27) * bVar11 | (bVar11 >= bVar27) * bVar27) != bVar11;
  bVar5 = (byte)((bVar12 < bVar28) * bVar12 | (bVar12 >= bVar28) * bVar28) == bVar12;
  bVar6 = (byte)((bVar14 < bVar30) * bVar14 | (bVar14 >= bVar30) * bVar30) == bVar14;
  bVar7 = (byte)((bVar15 < bVar31) * bVar15 | (bVar15 >= bVar31) * bVar31) != bVar15;
  if ((bool)~bVar1) {
    (pIVar39->tld_hyperlog).hllv[0] = bVar8;
  }
  if (bVar2) {
    (pIVar39->tld_hyperlog).hllv[1] = bVar9;
  }
  if (!bVar3) {
    (pIVar39->tld_hyperlog).hllv[2] = bVar10;
  }
  if (bVar4) {
    (pIVar39->tld_hyperlog).hllv[3] = bVar11;
  }
  if ((bool)~bVar5) {
    (pIVar39->tld_hyperlog).hllv[4] = bVar12;
  }
  if ((byte)((bVar13 < bVar29) * bVar13 | (bVar13 >= bVar29) * bVar29) != bVar13) {
    (pIVar39->tld_hyperlog).hllv[5] = bVar13;
  }
  if ((bool)(~bVar6 & 1)) {
    (pIVar39->tld_hyperlog).hllv[6] = bVar14;
  }
  if (bVar7) {
    (pIVar39->tld_hyperlog).hllv[7] = bVar15;
  }
  if ((bool)(~bVar1 & 1)) {
    (pIVar39->tld_hyperlog).hllv[8] = uVar16;
  }
  if (bVar2) {
    (pIVar39->tld_hyperlog).hllv[9] = uVar17;
  }
  if ((bool)(~bVar3 & 1)) {
    (pIVar39->tld_hyperlog).hllv[10] = uVar18;
  }
  if (bVar4) {
    (pIVar39->tld_hyperlog).hllv[0xb] = uVar19;
  }
  if ((bool)(~bVar5 & 1)) {
    (pIVar39->tld_hyperlog).hllv[0xc] = uVar20;
  }
  (pIVar39->tld_hyperlog).hllv[0xd] = uVar21;
  if ((bool)~bVar6) {
    (pIVar39->tld_hyperlog).hllv[0xe] = uVar22;
  }
  if (bVar7) {
    (pIVar39->tld_hyperlog).hllv[0xf] = uVar23;
  }
  uVar32 = this->sld_counts[0];
  uVar33 = this->sld_counts[1];
  uVar34 = this->sld_counts[2];
  uVar35 = this->sld_counts[3];
  uVar36 = this->sld_counts[4];
  uVar37 = this->sld_counts[5];
  uVar38 = this->sld_counts[7];
  pIVar39->sld_counts[6] = this->sld_counts[6];
  pIVar39->sld_counts[7] = uVar38;
  pIVar39->sld_counts[4] = uVar36;
  pIVar39->sld_counts[5] = uVar37;
  pIVar39->sld_counts[2] = uVar34;
  pIVar39->sld_counts[3] = uVar35;
  pIVar39->sld_counts[0] = uVar32;
  pIVar39->sld_counts[1] = uVar33;
  bVar8 = (this->sld_hyperlog).hllv[0];
  bVar9 = (this->sld_hyperlog).hllv[1];
  bVar10 = (this->sld_hyperlog).hllv[2];
  bVar11 = (this->sld_hyperlog).hllv[3];
  bVar12 = (this->sld_hyperlog).hllv[4];
  bVar13 = (this->sld_hyperlog).hllv[5];
  bVar14 = (this->sld_hyperlog).hllv[6];
  bVar15 = (this->sld_hyperlog).hllv[7];
  uVar16 = (this->sld_hyperlog).hllv[8];
  uVar17 = (this->sld_hyperlog).hllv[9];
  uVar18 = (this->sld_hyperlog).hllv[10];
  uVar19 = (this->sld_hyperlog).hllv[0xb];
  uVar20 = (this->sld_hyperlog).hllv[0xc];
  uVar21 = (this->sld_hyperlog).hllv[0xd];
  uVar22 = (this->sld_hyperlog).hllv[0xe];
  uVar23 = (this->sld_hyperlog).hllv[0xf];
  bVar24 = (pIVar39->sld_hyperlog).hllv[0];
  bVar25 = (pIVar39->sld_hyperlog).hllv[1];
  bVar26 = (pIVar39->sld_hyperlog).hllv[2];
  bVar27 = (pIVar39->sld_hyperlog).hllv[3];
  bVar28 = (pIVar39->sld_hyperlog).hllv[4];
  bVar29 = (pIVar39->sld_hyperlog).hllv[5];
  bVar30 = (pIVar39->sld_hyperlog).hllv[6];
  bVar31 = (pIVar39->sld_hyperlog).hllv[7];
  bVar1 = (byte)((bVar8 < bVar24) * bVar8 | (bVar8 >= bVar24) * bVar24) == bVar8;
  bVar2 = (byte)((bVar9 < bVar25) * bVar9 | (bVar9 >= bVar25) * bVar25) != bVar9;
  bVar3 = (byte)((bVar10 < bVar26) * bVar10 | (bVar10 >= bVar26) * bVar26) == bVar10;
  bVar4 = (byte)((bVar11 < bVar27) * bVar11 | (bVar11 >= bVar27) * bVar27) != bVar11;
  bVar5 = (byte)((bVar12 < bVar28) * bVar12 | (bVar12 >= bVar28) * bVar28) == bVar12;
  bVar6 = (byte)((bVar14 < bVar30) * bVar14 | (bVar14 >= bVar30) * bVar30) == bVar14;
  bVar7 = (byte)((bVar15 < bVar31) * bVar15 | (bVar15 >= bVar31) * bVar31) != bVar15;
  if ((bool)~bVar1) {
    (pIVar39->sld_hyperlog).hllv[0] = bVar8;
  }
  if (bVar2) {
    (pIVar39->sld_hyperlog).hllv[1] = bVar9;
  }
  if (!bVar3) {
    (pIVar39->sld_hyperlog).hllv[2] = bVar10;
  }
  if (bVar4) {
    (pIVar39->sld_hyperlog).hllv[3] = bVar11;
  }
  if ((bool)~bVar5) {
    (pIVar39->sld_hyperlog).hllv[4] = bVar12;
  }
  if ((byte)((bVar13 < bVar29) * bVar13 | (bVar13 >= bVar29) * bVar29) != bVar13) {
    (pIVar39->sld_hyperlog).hllv[5] = bVar13;
  }
  if ((bool)(~bVar6 & 1)) {
    (pIVar39->sld_hyperlog).hllv[6] = bVar14;
  }
  if (bVar7) {
    (pIVar39->sld_hyperlog).hllv[7] = bVar15;
  }
  if ((bool)(~bVar1 & 1)) {
    (pIVar39->sld_hyperlog).hllv[8] = uVar16;
  }
  if (bVar2) {
    (pIVar39->sld_hyperlog).hllv[9] = uVar17;
  }
  if ((bool)(~bVar3 & 1)) {
    (pIVar39->sld_hyperlog).hllv[10] = uVar18;
  }
  if (bVar4) {
    (pIVar39->sld_hyperlog).hllv[0xb] = uVar19;
  }
  if ((bool)(~bVar5 & 1)) {
    (pIVar39->sld_hyperlog).hllv[0xc] = uVar20;
  }
  (pIVar39->sld_hyperlog).hllv[0xd] = uVar21;
  if ((bool)~bVar6) {
    (pIVar39->sld_hyperlog).hllv[0xe] = uVar22;
  }
  if (bVar7) {
    (pIVar39->sld_hyperlog).hllv[0xf] = uVar23;
  }
  uVar32 = this->name_parts[0];
  uVar33 = this->name_parts[1];
  uVar34 = this->name_parts[2];
  uVar35 = this->name_parts[3];
  uVar36 = this->name_parts[4];
  uVar37 = this->name_parts[5];
  uVar38 = this->name_parts[7];
  pIVar39->name_parts[6] = this->name_parts[6];
  pIVar39->name_parts[7] = uVar38;
  pIVar39->name_parts[4] = uVar36;
  pIVar39->name_parts[5] = uVar37;
  pIVar39->name_parts[2] = uVar34;
  pIVar39->name_parts[3] = uVar35;
  pIVar39->name_parts[0] = uVar32;
  pIVar39->name_parts[1] = uVar33;
  uVar32 = this->rr_types[1];
  uVar33 = this->rr_types[2];
  uVar34 = this->rr_types[3];
  uVar35 = this->rr_types[4];
  uVar36 = this->rr_types[5];
  uVar37 = this->rr_types[6];
  uVar38 = this->rr_types[7];
  pIVar39->rr_types[0] = this->rr_types[0];
  pIVar39->rr_types[1] = uVar32;
  pIVar39->rr_types[2] = uVar33;
  pIVar39->rr_types[3] = uVar34;
  pIVar39->rr_types[4] = uVar35;
  pIVar39->rr_types[5] = uVar36;
  pIVar39->rr_types[6] = uVar37;
  pIVar39->rr_types[7] = uVar38;
  uVar32 = this->locales[1];
  uVar33 = this->locales[2];
  uVar34 = this->locales[3];
  uVar35 = this->locales[4];
  uVar36 = this->locales[5];
  uVar37 = this->locales[6];
  uVar38 = this->locales[7];
  pIVar39->locales[0] = this->locales[0];
  pIVar39->locales[1] = uVar32;
  pIVar39->locales[2] = uVar33;
  pIVar39->locales[3] = uVar34;
  pIVar39->locales[4] = uVar35;
  pIVar39->locales[5] = uVar36;
  pIVar39->locales[6] = uVar37;
  pIVar39->locales[7] = uVar38;
  return pIVar39;
}

Assistant:

IPStatsRecord* IPStatsRecord::CreateCopy()
{
    IPStatsRecord * isr = new IPStatsRecord();

    if (isr != NULL) {
        isr->ipaddr_length = ipaddr_length;
        isr->query_volume = query_volume;
        isr->arpa_count = arpa_count;
        isr->no_such_domain_queries = no_such_domain_queries;
        isr->no_such_domain_reserved = no_such_domain_reserved;
        isr->no_such_domain_frequent = no_such_domain_frequent;
        isr->no_such_domain_chromioids = no_such_domain_chromioids;

        memcpy(isr->ip_addr, ip_addr, ipaddr_length);
        memcpy(isr->hourly_volume, hourly_volume, sizeof(hourly_volume));
        memcpy(isr->daily_volume, daily_volume, sizeof(daily_volume));
        memcpy(isr->tld_counts, tld_counts, sizeof(tld_counts));
        isr->tld_hyperlog.AddLogs(&tld_hyperlog);
        memcpy(isr->sld_counts, sld_counts, sizeof(sld_counts));
        isr->sld_hyperlog.AddLogs(&sld_hyperlog);
        memcpy(isr->name_parts, name_parts, sizeof(name_parts));
        memcpy(isr->rr_types, rr_types, sizeof(rr_types));
        memcpy(isr->locales, locales, sizeof(locales));
    }
    return isr;
}